

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int should_send_datagram_frame(quicly_conn_t *conn)

{
  quicly_conn_t *conn_local;
  int local_4;
  
  if ((conn->egress).datagram_frame_payloads.count == 0) {
    local_4 = 0;
  }
  else if (conn->application == (st_quicly_application_space_t *)0x0) {
    local_4 = 0;
  }
  else if ((conn->application->cipher).egress.key.aead == (ptls_aead_context_t *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int should_send_datagram_frame(quicly_conn_t *conn)
{
    if (conn->egress.datagram_frame_payloads.count == 0)
        return 0;
    if (conn->application == NULL)
        return 0;
    if (conn->application->cipher.egress.key.aead == NULL)
        return 0;
    return 1;
}